

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenMemoryInitSetSegment(BinaryenExpressionRef expr,char *segment)

{
  IString *this;
  undefined1 in_CL;
  string_view sVar1;
  
  if (expr->_id == MemoryInitId) {
    this = (IString *)strlen(segment);
    sVar1._M_str = (char *)0x0;
    sVar1._M_len = (size_t)segment;
    sVar1 = wasm::IString::interned(this,sVar1,(bool)in_CL);
    *(string_view *)(expr + 1) = sVar1;
    return;
  }
  __assert_fail("expression->is<MemoryInit>()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xd8f,"void BinaryenMemoryInitSetSegment(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenMemoryInitSetSegment(BinaryenExpressionRef expr,
                                  const char* segment) {
  auto* expression = (Expression*)expr;
  assert(expression->is<MemoryInit>());
  static_cast<MemoryInit*>(expression)->segment = Name(segment);
}